

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error adios2_set_parameters(adios2_io *io,char *parameters)

{
  string *in_RSI;
  adios2_io *in_RDI;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"for adios2_io, in call to adios2_set_parameters",&local_39)
  ;
  adios2::helper::CheckForNullptr<adios2_io>(in_RDI,in_RSI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)in_RSI,&local_71);
  adios2::core::IO::SetParameters((string *)in_RDI);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_parameters(adios2_io *io, const char *parameters)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_set_parameters");
        reinterpret_cast<adios2::core::IO *>(io)->SetParameters(parameters);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_parameters"));
    }
}